

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

SyntaxNode * slang::ast::findOverrideNodeSource(HierarchyOverrideNode *node)

{
  bool bVar1;
  type *ptVar2;
  HierarchyOverrideNode *in_RDI;
  SyntaxNode *result;
  type *val_1;
  type *__2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  flat_hash_map<OpaqueInstancePath::Entry,_HierarchyOverrideNode> *__range2_1;
  type *__1;
  type *info;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
  *__range2;
  type *val;
  type *_;
  const_iterator __end3;
  const_iterator __begin3;
  flat_hash_map<const_syntax::SyntaxNode_*,_std::pair<ConstantValue,_const_syntax::SyntaxNode_*>_>
  *__range3;
  SyntaxNode *in_stack_ffffffffffffff38;
  type *in_stack_ffffffffffffff40;
  __normal_iterator<const_std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_*,_std::vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>_>
  local_60;
  vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
  *local_58;
  type *local_50;
  type *local_48;
  reference local_40;
  const_iterator local_38;
  const_iterator local_28;
  HierarchyOverrideNode *in_stack_ffffffffffffffe8;
  
  bVar1 = boost::unordered::
          unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
          ::empty((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                   *)0x993eac);
  if (!bVar1) {
    in_stack_ffffffffffffffe8 = in_RDI;
    local_28 = boost::unordered::
               unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               ::begin((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                        *)0x993ed1);
    local_38 = boost::unordered::
               unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               ::end((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                      *)0x993eee);
    while (bVar1 = boost::unordered::detail::foa::operator!=
                             ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                               *)in_stack_ffffffffffffff40,
                              (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                               *)in_stack_ffffffffffffff38), bVar1) {
      local_40 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)in_stack_ffffffffffffff40);
      local_48 = std::
                 get<0ul,slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>
                           ((pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>
                             *)0x993f3b);
      local_50 = std::
                 get<1ul,slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>
                           ((pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>
                             *)0x993f50);
      if (local_50->second != (SyntaxNode *)0x0) {
        return local_50->second;
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                    *)in_stack_ffffffffffffff40);
    }
  }
  local_58 = &in_RDI->binds;
  local_60._M_current =
       (pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*> *)
       std::
       vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
       ::begin((vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
                *)in_stack_ffffffffffffff38);
  std::
  vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
  ::end((vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
         *)in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_*,_std::vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>_>
                           ((__normal_iterator<const_std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_*,_std::vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>_>
                             *)in_stack_ffffffffffffff40,
                            (__normal_iterator<const_std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_*,_std::vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>_>
                             *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_*,_std::vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>_>
    ::operator*(&local_60);
    ptVar2 = std::get<0ul,slang::ast::BindDirectiveInfo,slang::syntax::SyntaxNode_const*>
                       ((pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*> *)
                        0x993fec);
    std::get<1ul,slang::ast::BindDirectiveInfo,slang::syntax::SyntaxNode_const*>
              ((pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*> *)0x993ffb);
    if (ptVar2->bindSyntax != (BindDirectiveSyntax *)0x0) {
      return (SyntaxNode *)ptVar2->bindSyntax;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_*,_std::vector<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>_>
    ::operator++(&local_60);
  }
  boost::unordered::
  unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  ::begin((unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
           *)0x994049);
  boost::unordered::
  unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  ::end((unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
         *)0x99405d);
  while( true ) {
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_ffffffffffffff40,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) {
      return (SyntaxNode *)0x0;
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)in_stack_ffffffffffffff40);
    std::get<0ul,slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>
              ((pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                *)0x994095);
    in_stack_ffffffffffffff40 =
         std::get<1ul,slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>
                   ((pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                     *)0x9940a4);
    in_stack_ffffffffffffff38 = findOverrideNodeSource(in_stack_ffffffffffffffe8);
    if (in_stack_ffffffffffffff38 != (SyntaxNode *)0x0) break;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                  *)in_stack_ffffffffffffff40);
  }
  return in_stack_ffffffffffffff38;
}

Assistant:

static const SyntaxNode* findOverrideNodeSource(const HierarchyOverrideNode& node) {
    // Try to find some concrete syntax node (defparam or bind directive) that
    // caused us to have this override node.
    if (!node.paramOverrides.empty()) {
        for (auto& [_, val] : node.paramOverrides) {
            if (val.second)
                return val.second;
        }
    }

    for (auto& [info, _] : node.binds) {
        if (info.bindSyntax)
            return info.bindSyntax;
    }

    for (auto& [_, val] : node.childNodes) {
        if (auto result = findOverrideNodeSource(val))
            return result;
    }

    return nullptr;
}